

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

Maybe<capnp::_::RawBrandedSchema_*&> __thiscall
kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::
find<capnp::_::RawSchema_const*&>
          (HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*> *this,RawSchema **key)

{
  Maybe<capnp::_::RawBrandedSchema_*&> MVar1;
  long lVar2;
  ArrayPtr<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> table;
  HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>
  local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>::
  find<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry,capnp::_::RawSchema_const*&>
            (local_20,table,(RawSchema **)((long)(*(long *)(this + 8) - *(size_t *)this) >> 4));
  lVar2 = 0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>)0x0
     ) {
    lVar2 = local_18 * 0x10 + *(long *)this;
  }
  MVar1.ptr = (RawBrandedSchema **)(lVar2 + 8);
  if (lVar2 == 0) {
    MVar1.ptr = (RawBrandedSchema **)0x0;
  }
  return (Maybe<capnp::_::RawBrandedSchema_*&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}